

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

base_learner * lda_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  uint32_t uVar3;
  parser *ppVar4;
  option_group_definition *ring_size;
  pointer plVar5;
  ostream *this;
  float *pfVar6;
  size_t sVar7;
  parser *ppVar8;
  learner<lda,_example> *this_00;
  vw *in_RSI;
  long *in_RDI;
  float fVar9;
  float fVar10;
  learner<lda,_example> *l;
  size_t minibatch2;
  float temp;
  int math_mode;
  option_group_definition new_options;
  free_ptr<lda> ld;
  undefined4 in_stack_fffffffffffff598;
  uint32_t in_stack_fffffffffffff59c;
  typed_option<float> *in_stack_fffffffffffff5a0;
  prediction_type_t pred_type;
  string *in_stack_fffffffffffff5a8;
  code *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffff5c0;
  typed_option<float> *in_stack_fffffffffffff5e8;
  option_group_definition *in_stack_fffffffffffff5f0;
  size_t in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  float local_860;
  float local_85c;
  undefined1 local_858 [24];
  undefined4 local_840;
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [199];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [199];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [199];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [199];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [199];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  typed_option<float> local_318;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  typed_option<float> local_228;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_long> local_138;
  lda_math_mode local_98;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [72];
  vw *local_18;
  long *local_10;
  typed_option<float> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<lda>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Latent Dirichlet Allocation",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"lda",&local_159);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x2225e8);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff5a8,(unsigned_long *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<unsigned_long>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Run lda with <int> topics",&local_181);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff5f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"lda_alpha",&local_249);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x2226cf);
  VW::config::make_option<float>(in_stack_fffffffffffff5a8,(float *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<float>::keep(&local_228,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff5b0,
             (float)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,"Prior on sparsity of per-document topic weights",&local_271);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"lda_rho",&local_339);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x2227d9);
  VW::config::make_option<float>(in_stack_fffffffffffff5a8,(float *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<float>::keep(&local_318,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff5b0,
             (float)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"Prior on sparsity of topic distributions",&local_361);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"lda_D",&local_429);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x2228e3);
  VW::config::make_option<float>(in_stack_fffffffffffff5a8,(float *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff5b0,
             (float)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"Number of documents",&local_451);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"lda_epsilon",&local_519);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x2229d1);
  VW::config::make_option<float>(in_stack_fffffffffffff5a8,(float *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff5b0,
             (float)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"Loop convergence threshold",&local_541);
  ppVar4 = (parser *)
           VW::config::typed_option<float>::help
                     (in_stack_fffffffffffff5a0,
                      (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  ring_size = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                        (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"minibatch",&local_609);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x222abf);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff5a8,(unsigned_long *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff5b0,
             (unsigned_long)in_stack_fffffffffffff5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"Minibatch size, for LDA",&local_631);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff5f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"math-mode",&local_6f9);
  VW::config::make_option<int>(in_stack_fffffffffffff5a8,(int *)in_stack_fffffffffffff5a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff5b0,
             (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"Math mode: simd, accuracy, fast-approx",&local_721);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff5f0,(typed_option<int> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"metrics",&local_7e9);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x222c86);
  VW::config::make_option<bool>(in_stack_fffffffffffff5a8,(bool *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"Compute metrics",&local_811);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,
             (string *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff5f0,(typed_option<bool> *)in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_10)(local_10,local_60);
  plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                     ((unique_ptr<lda,_void_(*)(void_*)> *)0x222f4d);
  plVar5->mmode = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"lda",&local_839);
  bVar2 = (**(code **)(*local_10 + 8))();
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x223698);
    local_18->lda = (uint32_t)plVar5->topics;
    local_18->delete_prediction = delete_scalars;
    memset(local_858,0,0x18);
    std::vector<index_feature,_std::allocator<index_feature>_>::vector
              ((vector<index_feature,_std::allocator<index_feature>_> *)0x2236e2);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x2236ef);
    std::vector<index_feature,_std::allocator<index_feature>_>::operator=
              ((vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff5b0,
               (vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff5a8);
    std::vector<index_feature,_std::allocator<index_feature>_>::~vector
              ((vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff5b0);
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x223720);
    pvVar1 = local_18;
    plVar5->total_lambda_init = false;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x223744);
    plVar5->all = pvVar1;
    fVar9 = local_18->initial_t;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x22377d);
    plVar5->example_t = (double)fVar9;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x22379b);
    if ((plVar5->compute_coherence_metrics & 1U) != 0) {
      std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                ((unique_ptr<lda,_void_(*)(void_*)> *)0x2237b1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5c0,
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                ((unique_ptr<lda,_void_(*)(void_*)> *)0x2237e6);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(in_stack_fffffffffffff5c0,
               CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
    }
    fVar9 = logf((float)(local_18->lda * 2 + 1));
    fVar10 = logf(2.0);
    local_85c = ceilf(fVar9 / fVar10);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff59c);
    local_18->random_weights = true;
    local_18->add_constant = false;
    if (1.0 < local_18->eta) {
      this = std::operator<<((ostream *)&std::cerr,"your learning rate is too high, setting it to 1"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_860 = 1.0;
      pfVar6 = std::min<float>(&local_18->eta,&local_860);
      local_18->eta = *pfVar6;
    }
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x223962);
    sVar7 = next_pow2(plVar5->minibatch);
    if (local_18->p->ring_size < sVar7) {
      ppVar8 = local_18->p;
      if (ppVar8 != (parser *)0x0) {
        parser::~parser((parser *)in_stack_fffffffffffff5b0);
        operator_delete(ppVar8);
      }
      ppVar8 = (parser *)operator_new(0x398);
      parser::parser(ppVar4,(size_t)ring_size);
      local_18->p = ppVar8;
    }
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x223a2c);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x223a54);
    v_array<float>::resize
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
               in_stack_fffffffffffff788);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x223a7a);
    v_array<float>::push_back
              ((v_array<float> *)in_stack_fffffffffffff5a0,
               (float *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
    pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff5a0 >> 0x20);
    memcpy(&local_18->p->lp,no_label::no_label_parser,0x48);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x223acc);
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x223b08);
    if ((plVar5->compute_coherence_metrics & 1U) == 0) {
      in_stack_fffffffffffff5b0 = predict;
    }
    else {
      in_stack_fffffffffffff5b0 = predict_with_metrics;
    }
    ppVar4 = (parser *)in_stack_fffffffffffff5b0;
    uVar3 = parameters::stride_shift
                      ((parameters *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
    this_00 = LEARNER::init_learner<lda,example,LEARNER::learner<char,example>>
                        ((free_ptr<lda> *)ppVar4,
                         (_func_void_lda_ptr_learner<char,_example>_ptr_example_ptr *)
                         CONCAT44(uVar3,in_stack_fffffffffffff5b8),in_stack_fffffffffffff5b0,
                         (size_t)in_stack_fffffffffffff5a8,pred_type);
    LEARNER::learner<lda,_example>::set_save_load(this_00,save_load);
    LEARNER::learner<lda,_example>::set_finish_example(this_00,finish_example);
    LEARNER::learner<lda,_example>::set_end_examples
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff5b8));
    LEARNER::learner<lda,_example>::set_end_pass
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff5b8));
    LEARNER::learner<lda,_example>::set_finish
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff5b8));
    in_stack_fffffffffffff5a0 = (typed_option<float> *)LEARNER::make_base<lda,example>(this_00);
    local_8 = in_stack_fffffffffffff5a0;
  }
  else {
    local_8 = (typed_option<float> *)0x0;
  }
  local_840 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff5a0);
  std::unique_ptr<lda,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<lda,_void_(*)(void_*)> *)in_stack_fffffffffffff5b0);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}